

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O1

Var Js::JavascriptSymbol::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptSymbol *pJVar6;
  JavascriptSymbolObject *pJVar7;
  JavascriptString *pJVar8;
  PropertyRecord *propertyRecord;
  int in_stack_00000010;
  undefined1 local_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x4d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d333d6;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_30 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_30,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)local_30 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x4e,"(args.Info.Count)","Should always have implicit \'this\'.");
    if (!bVar3) goto LAB_00d333d6;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x51,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d333d6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_30,0);
  bVar3 = VarIs<Js::JavascriptSymbol>(pvVar5);
  if (bVar3) {
    pJVar6 = VarTo<Js::JavascriptSymbol>(pvVar5);
  }
  else {
    bVar3 = VarIs<Js::JavascriptSymbolObject>(pvVar5);
    if (!bVar3) {
      pvVar5 = TryInvokeRemotelyOrThrow
                         (EntryToString,pSVar1,(Arguments *)local_30,-0x7ff5ea1a,
                          L"Symbol.prototype.toString");
      return pvVar5;
    }
    pJVar7 = VarTo<Js::JavascriptSymbolObject>(pvVar5);
    pJVar6 = (pJVar7->value).ptr;
    if (pJVar6 == (JavascriptSymbol *)0x0) {
      propertyRecord = (PropertyRecord *)0x0;
      goto LAB_00d333a0;
    }
  }
  propertyRecord = (pJVar6->propertyRecordUsageCache).propertyRecord.ptr;
LAB_00d333a0:
  pJVar8 = ToString(propertyRecord,pSVar1);
  return pJVar8;
}

Assistant:

Var JavascriptSymbol::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count, "Should always have implicit 'this'.");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        const PropertyRecord* val;
        Var aValue = args[0];
        if (VarIs<JavascriptSymbol>(aValue))
        {
            val = VarTo<JavascriptSymbol>(aValue)->GetValue();
        }
        else if (VarIs<JavascriptSymbolObject>(aValue))
        {
            val = VarTo<JavascriptSymbolObject>(aValue)->GetValue();
        }
        else
        {
            return TryInvokeRemotelyOrThrow(EntryToString, scriptContext, args, JSERR_This_NeedSymbol, _u("Symbol.prototype.toString"));
        }

        return JavascriptSymbol::ToString(val, scriptContext);
    }